

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

string * __thiscall
cmTarget::ImportedGetFullPath
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool pimplib)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  size_type __dnew;
  string impProp;
  string suffix;
  string config_upper;
  char *imp;
  char *loc;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  char *local_40;
  char *local_38;
  
  if (this->IsImportedTarget == false) {
    __assert_fail("this->IsImported()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmTarget.cxx"
                  ,0x795,
                  "std::string cmTarget::ImportedGetFullPath(const std::string &, bool) const");
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  if (config->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,0x4d2773);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_88,config);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
  }
  local_48 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  paVar1 = &local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)paVar1;
  if (this->TargetTypeValue == INTERFACE_LIBRARY) goto LAB_003d0fb9;
  bVar3 = GetMappedConfig(this,&local_68,&local_38,&local_40,&local_88);
  if (!bVar3) goto LAB_003d0fb9;
  if (pimplib) {
    pcVar4 = local_40;
    if (local_40 != (char *)0x0) {
LAB_003d0e0b:
      pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)pcVar4);
      goto LAB_003d0fb9;
    }
    if (this->TargetTypeValue != SHARED_LIBRARY) {
      bVar3 = IsExecutableWithExports(this);
      if (!bVar3) goto LAB_003d0fb9;
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
    local_a8.field_2._M_local_buf[7] = 'D';
    local_a8.field_2._8_7_ = 0x42494c504d495f;
    local_a8._M_string_length = 0xf;
    local_a8.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    pcVar4 = GetProperty(this,&local_a8,this->Makefile);
    if (pcVar4 == (char *)0x0) {
      local_c8.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
      local_c8.field_2._M_local_buf[7] = 'D';
      local_c8.field_2._8_7_ = 0x42494c504d495f;
      local_c8._M_string_length = 0xf;
      local_c8.field_2._M_local_buf[0xf] = '\0';
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar4 = GetProperty(this,&local_c8,this->Makefile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 local_c8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar4);
      }
    }
    else {
      pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)pcVar4);
    }
  }
  else {
    pcVar4 = local_38;
    if (local_38 != (char *)0x0) goto LAB_003d0e0b;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_c8._M_dataplus._M_p = (pointer)0x11;
    local_a8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_c8);
    local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_c8._M_dataplus._M_p,0);
    local_a8.field_2._M_local_buf[7] = (char)((ulong)local_c8._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_a8._M_dataplus._M_p = 0x444554524f504d49;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 8) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 9) = 'L';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 10) = 'O';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xb) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xc) = 'A';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xd) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xe) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xf) = 'O';
    local_a8._M_dataplus._M_p[0x10] = 'N';
    local_a8._M_string_length = (size_type)local_c8._M_dataplus._M_p;
    local_a8._M_dataplus._M_p[(long)local_c8._M_dataplus._M_p] = '\0';
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
    pcVar4 = GetProperty(this,&local_a8,this->Makefile);
    if (pcVar4 == (char *)0x0) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"IMPORTED_LOCATION","");
      pcVar4 = GetProperty(this,&local_c8,this->Makefile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 local_c8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar4);
      }
    }
    else {
      pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)pcVar4);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT17(local_a8.field_2._M_local_buf[7],
                             local_a8.field_2._M_allocated_capacity._0_7_) + 1);
  }
LAB_003d0fb9:
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmTarget::ImportedGetFullPath(const std::string& config, bool pimplib) const
{
  assert(this->IsImported());

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  else
    {
    config_upper = "NOCONFIG";
    }

  std::string result;

  const char* loc = 0;
  const char* imp = 0;
  std::string suffix;

  if(this->GetType() != cmState::INTERFACE_LIBRARY
     && this->GetMappedConfig(config_upper, &loc, &imp, suffix))
    {
    if (!pimplib)
      {
      if(loc)
        {
        result = loc;
        }
      else
        {
        std::string impProp = "IMPORTED_LOCATION";
        impProp += suffix;
        if(const char* config_location = this->GetProperty(impProp))
          {
          result = config_location;
          }
        else if(const char* location =
                this->GetProperty("IMPORTED_LOCATION"))
          {
          result = location;
          }
        }
      }
    else
      {
      if(imp)
        {
        result = imp;
        }
      else if(this->GetType() == cmState::SHARED_LIBRARY ||
              this->IsExecutableWithExports())
        {
        std::string impProp = "IMPORTED_IMPLIB";
        impProp += suffix;
        if(const char* config_implib = this->GetProperty(impProp))
          {
          result = config_implib;
          }
        else if(const char* implib = this->GetProperty("IMPORTED_IMPLIB"))
          {
          result = implib;
          }
        }
      }
    }

  if(result.empty())
    {
    result = this->GetName();
    result += "-NOTFOUND";
    }
  return result;
}